

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O3

ExpandMacroResult
cmCMakePresetsGraphInternal::ExpandMacro
          (string *out,string *macroNamespace,string *macroName,MacroExpanderVector *macroExpanders,
          int version)

{
  pointer puVar1;
  MacroExpander *pMVar2;
  ExpandMacroResult EVar3;
  int iVar4;
  unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
  *macroExpander;
  pointer puVar5;
  
  puVar5 = (macroExpanders->
           super__Vector_base<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (macroExpanders->
           super__Vector_base<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (puVar5 == puVar1) {
      iVar4 = std::__cxx11::string::compare((char *)macroNamespace);
      return Error - (iVar4 == 0);
    }
    pMVar2 = (puVar5->_M_t).
             super___uniq_ptr_impl<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::MacroExpander_*,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
             .super__Head_base<0UL,_cmCMakePresetsGraphInternal::MacroExpander_*,_false>.
             _M_head_impl;
    EVar3 = (**pMVar2->_vptr_MacroExpander)(pMVar2,macroNamespace,macroName,out,version);
    if (EVar3 != Ignore) break;
    puVar5 = puVar5 + 1;
  }
  return EVar3;
}

Assistant:

ExpandMacroResult cmCMakePresetsGraphInternal::ExpandMacro(
  std::string& out, const std::string& macroNamespace,
  const std::string& macroName, MacroExpanderVector const& macroExpanders,
  int version)
{
  for (auto const& macroExpander : macroExpanders) {
    auto result = (*macroExpander)(macroNamespace, macroName, out, version);
    if (result != ExpandMacroResult::Ignore) {
      return result;
    }
  }

  if (macroNamespace == "vendor") {
    return ExpandMacroResult::Ignore;
  }

  return ExpandMacroResult::Error;
}